

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
Temperature_ConversionsUnitPrecise2Unit_Test::TestBody
          (Temperature_ConversionsUnitPrecise2Unit_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_2a0;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_19;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_18;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_17;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_16;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_15;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_14;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_13;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_12;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_11;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_10;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_9;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_8;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_7;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_6;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_5;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_4;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_3;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_2;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_1;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Temperature_ConversionsUnitPrecise2Unit_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (-40.0,(precise_unit *)units::precise::degC,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_20,"convert(neg_forty_C, precise::degC, degF)","neg_forty_C_in_F",
             "test::precise_tolerance",dVar3,-40.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (-40.0,(precise_unit *)units::precise::degC,(unit *)&units::K);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_50,"convert(neg_forty_C, precise::degC, K)","neg_forty_C_in_K",
             "test::precise_tolerance",dVar3,233.15,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (-40.0,(precise_unit *)units::precise::degF,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_70,"convert(neg_forty_C_in_F, precise::degF, degC)","neg_forty_C",
             "test::precise_tolerance",dVar3,-40.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (233.15,(precise_unit *)units::precise::K,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,"convert(neg_forty_C_in_K, precise::K, degC)","neg_forty_C",
             "test::precise_tolerance",dVar3,-40.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (233.15,(precise_unit *)units::precise::K,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b0,"convert(neg_forty_C_in_K, precise::K, degF)","neg_forty_C_in_F",
             "test::precise_tolerance",dVar3,-40.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x10c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (0.0,(precise_unit *)units::precise::degC,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d0,"convert(zero_C, precise::degC, degF)","zero_C_in_F",
             "test::precise_tolerance",dVar3,32.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (0.0,(precise_unit *)units::precise::degC,(unit *)&units::K);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f0,"convert(zero_C, precise::degC, K)","zero_C_in_K",
             "test::precise_tolerance",dVar3,273.15,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (32.0,(precise_unit *)units::precise::degF,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_110,"convert(zero_C_in_F, precise::degF, degC)","zero_C",
             "test::precise_tolerance",dVar3,0.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (273.15,(precise_unit *)units::precise::K,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_130,"convert(zero_C_in_K, precise::K, degC)","zero_C",
             "test::precise_tolerance",dVar3,0.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (273.15,(precise_unit *)units::precise::K,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_150,"convert(zero_C_in_K, precise::K, degF)","zero_C_in_F",
             "test::precise_tolerance",dVar3,32.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (5.0,(precise_unit *)units::precise::degC,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_170,"convert(five_C, precise::degC, degF)","five_C_in_F",
             "test::precise_tolerance",dVar3,41.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (5.0,(precise_unit *)units::precise::degC,(unit *)&units::K);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_190,"convert(five_C, precise::degC, K)","five_C_in_K",
             "test::precise_tolerance",dVar3,278.15,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (41.0,(precise_unit *)units::precise::degF,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1b0,"convert(five_C_in_F, precise::degF, degC)","five_C",
             "test::precise_tolerance",dVar3,5.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (278.15,(precise_unit *)units::precise::K,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1d0,"convert(five_C_in_K, precise::K, degC)","five_C",
             "test::precise_tolerance",dVar3,5.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (278.15,(precise_unit *)units::precise::K,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f0,"convert(five_C_in_K, precise::K, degF)","five_C_in_F",
             "test::precise_tolerance",dVar3,41.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (100.0,(precise_unit *)units::precise::degC,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_210,"convert(hundred_C, precise::degC, degF)","hundred_C_in_F",
             "test::precise_tolerance",dVar3,212.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (100.0,(precise_unit *)units::precise::degC,(unit *)&units::K);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_230,"convert(hundred_C, precise::degC, K)","hundred_C_in_K",
             "test::precise_tolerance",dVar3,373.15,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (212.0,(precise_unit *)units::precise::degF,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_250,"convert(hundred_C_in_F, precise::degF, degC)","hundred_C",
             "test::precise_tolerance",dVar3,100.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (373.15,(precise_unit *)units::precise::K,(unit *)&units::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_270,"convert(hundred_C_in_K, precise::K, degC)","hundred_C",
             "test::precise_tolerance",dVar3,100.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  dVar3 = units::convert<units::precise_unit,units::unit>
                    (373.15,(precise_unit *)units::precise::K,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_290,"convert(hundred_C_in_K, precise::K, degF)","hundred_C_in_F",
             "test::precise_tolerance",dVar3,212.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  return;
}

Assistant:

TEST(Temperature, ConversionsUnitPrecise2Unit)
{
    using namespace units;
    EXPECT_NEAR(
        convert(neg_forty_C, precise::degC, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C, precise::degC, K),
        neg_forty_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(neg_forty_C_in_F, precise::degF, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, precise::K, degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, precise::K, degF),
        neg_forty_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C, precise::degC, degF),
        zero_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C, precise::degC, K),
        zero_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C_in_F, precise::degF, degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, precise::K, degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, precise::K, degF),
        zero_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C, precise::degC, degF),
        five_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C, precise::degC, K),
        five_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C_in_F, precise::degF, degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, precise::K, degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, precise::K, degF),
        five_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C, precise::degC, degF),
        hundred_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C, precise::degC, K),
        hundred_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C_in_F, precise::degF, degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, precise::K, degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, precise::K, degF),
        hundred_C_in_F,
        test::precise_tolerance);
}